

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

void Abc_FlowRetime_ClearFlows(int fClearAll)

{
  ushort *puVar1;
  long lVar2;
  long lVar3;
  
  if (fClearAll != 0) {
    memset(pManMR->pDataArray,0,(long)pManMR->nNodes * 0x18);
    return;
  }
  if (0 < pManMR->nNodes) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      puVar1 = (ushort *)(&pManMR->pDataArray->field_0x0 + lVar2);
      *puVar1 = *puVar1 & 0xfff8;
      *(uint *)(&pManMR->pDataArray->field_0x10 + lVar2) =
           (uint)*(ushort *)(&pManMR->pDataArray->field_0x12 + lVar2) << 0x10;
      *(uint *)(&pManMR->pDataArray->field_0x10 + lVar2) =
           (uint)*(ushort *)(&pManMR->pDataArray->field_0x10 + lVar2);
      *(undefined8 *)((long)&pManMR->pDataArray->field_1 + lVar2) = 0;
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 < pManMR->nNodes);
  }
  return;
}

Assistant:

void Abc_FlowRetime_ClearFlows( int fClearAll ) {
  int i;

  if (fClearAll)
    memset(pManMR->pDataArray, 0, sizeof(Flow_Data_t)*pManMR->nNodes);
  else {
    // clear only data related to flow problem
    for(i=0; i<pManMR->nNodes; i++) {
      pManMR->pDataArray[i].mark &= ~(VISITED | FLOW );
      pManMR->pDataArray[i].e_dist = 0;
      pManMR->pDataArray[i].r_dist = 0;
      pManMR->pDataArray[i].pred = NULL;
    }
  }
}